

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O2

void duckdb_destroy_aggregate_function_set(duckdb_aggregate_function_set *set)

{
  FunctionSet<duckdb::AggregateFunction> *this;
  AggregateFunctionSet *aggregate_function_set;
  
  if ((set != (duckdb_aggregate_function_set *)0x0) &&
     (this = (FunctionSet<duckdb::AggregateFunction> *)*set,
     this != (FunctionSet<duckdb::AggregateFunction> *)0x0)) {
    duckdb::FunctionSet<duckdb::AggregateFunction>::~FunctionSet(this);
    operator_delete(this);
    *set = (duckdb_aggregate_function_set)0x0;
  }
  return;
}

Assistant:

void duckdb_destroy_aggregate_function_set(duckdb_aggregate_function_set *set) {
	if (set && *set) {
		auto aggregate_function_set = reinterpret_cast<duckdb::AggregateFunctionSet *>(*set);
		delete aggregate_function_set;
		*set = nullptr;
	}
}